

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Action<test_result_(int)> * __thiscall
testing::internal::OnCallSpec<test_result_(int)>::GetAction(OnCallSpec<test_result_(int)> *this)

{
  long in_RDI;
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  uVar1 = *(int *)(in_RDI + 0xc) == 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,".WillByDefault() must appear exactly once in an ON_CALL().",&local_29);
  UntypedOnCallSpecBase::AssertSpecProperty
            ((UntypedOnCallSpecBase *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),
             SUB81((ulong)in_RDI >> 0x38,0),(string *)0x142a6e);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return (Action<test_result_(int)> *)(in_RDI + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }